

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O2

void optimal_optimize(_encode_match_data *emd,matchp_enum_get_next_f *f,void *matchp_enum)

{
  ulong uVar1;
  long lVar2;
  int *piVar3;
  ushort uVar4;
  unsigned_short uVar5;
  void *pvVar6;
  undefined8 *puVar7;
  int iVar8;
  const_matchp pmVar9;
  ulong uVar10;
  interval_nodep p_Var11;
  long lVar12;
  long lVar13;
  uint uVar14;
  char *printf_str;
  long lVar15;
  float fVar16;
  
  pvVar6 = emd->priv;
  memset(optimal_optimize::offset_arr,0,0x200000);
  memset(optimal_optimize::offset_parr,0,0x200000);
  memset(optimal_optimize::len_arr,0,0x40000);
  puVar7 = *(undefined8 **)((long)pvVar6 + 0x28);
  while ((pmVar9 = (*f)(matchp_enum), pmVar9 != (const_matchp)0x0 &&
         (uVar10 = (ulong)pmVar9->len, uVar10 != 0))) {
    if ((pmVar9->offset != 0) &&
       ((iVar8 = optimal_optimize::len_arr[uVar10], optimal_optimize::len_arr[uVar10] = iVar8 + 1,
        iVar8 < -1 && (~LOG_DEBUG < G_log_level)))) {
      G_log_log_level = LOG_ERROR;
      log_log_default("len counter wrapped!\n");
    }
  }
  uVar10 = 0xffff;
  while (uVar1 = uVar10 - 1, -1 < (int)uVar1) {
    piVar3 = optimal_optimize::len_arr + (uVar1 & 0xffffffff);
    *piVar3 = *piVar3 + optimal_optimize::len_arr[uVar10];
    uVar10 = uVar1;
    if ((*piVar3 < 0) && (~LOG_DEBUG < G_log_level)) {
      G_log_log_level = LOG_ERROR;
      log_log_default("len counter wrapped!\n");
    }
  }
  p_Var11 = exo_optimize(optimal_optimize::len_arr,(int *)0x0,0x10,-1);
  *(interval_nodep *)((long)pvVar6 + 0x30) = p_Var11;
LAB_0010d43d:
  do {
    while( true ) {
      do {
        pmVar9 = (*f)(matchp_enum);
        if ((pmVar9 == (const_matchp)0x0) || (uVar4 = pmVar9->len, uVar4 == 0)) {
          lVar13 = 0x1a94ac;
          lVar12 = 0x3a94ac;
          for (uVar14 = 0xfffe; -1 < (int)uVar14; uVar14 = uVar14 - 1) {
            for (lVar15 = 0; lVar15 != 0x200000; lVar15 = lVar15 + 0x40000) {
              lVar2 = (ulong)uVar14 * 4 + lVar15;
              piVar3 = (int *)((long)optimal_optimize::offset_arr[0] + lVar2);
              *piVar3 = *piVar3 + *(int *)(lVar13 + lVar15);
              piVar3 = (int *)((long)optimal_optimize::offset_parr[0] + lVar2);
              *piVar3 = *piVar3 + *(int *)(lVar12 + lVar15);
            }
            lVar13 = lVar13 + -4;
            lVar12 = lVar12 + -4;
          }
          p_Var11 = exo_optimize(optimal_optimize::offset_arr[0],optimal_optimize::offset_parr[0],4,
                                 2);
          *puVar7 = p_Var11;
          p_Var11 = exo_optimize(optimal_optimize::offset_arr[1],optimal_optimize::offset_parr[1],
                                 0x10,4);
          puVar7[1] = p_Var11;
          p_Var11 = exo_optimize(optimal_optimize::offset_arr[2],optimal_optimize::offset_parr[2],
                                 0x10,4);
          puVar7[2] = p_Var11;
          p_Var11 = exo_optimize(optimal_optimize::offset_arr[3],optimal_optimize::offset_parr[3],
                                 0x10,4);
          puVar7[3] = p_Var11;
          p_Var11 = exo_optimize(optimal_optimize::offset_arr[4],optimal_optimize::offset_parr[4],
                                 0x10,4);
          puVar7[4] = p_Var11;
          p_Var11 = exo_optimize(optimal_optimize::offset_arr[5],optimal_optimize::offset_parr[5],
                                 0x10,4);
          puVar7[5] = p_Var11;
          p_Var11 = exo_optimize(optimal_optimize::offset_arr[6],optimal_optimize::offset_parr[6],
                                 0x10,4);
          puVar7[6] = p_Var11;
          p_Var11 = exo_optimize(optimal_optimize::offset_arr[7],optimal_optimize::offset_parr[7],
                                 0x10,4);
          puVar7[7] = p_Var11;
          if (~LOG_ERROR < G_log_level) {
            optimal_dump(0x1e,emd);
            return;
          }
          return;
        }
      } while (pmVar9->offset == 0);
      fVar16 = optimal_encode_int((uint)uVar4,*(void **)((long)pvVar6 + 0x30),(output_ctxp)0x0);
      iVar8 = ~(int)fVar16 + (uint)uVar4 + (uint)uVar4 * 8;
      uVar5 = pmVar9->len;
      if (uVar5 == 1) goto LAB_0010d51a;
      if (uVar5 != 2) break;
      uVar4 = pmVar9->offset;
      optimal_optimize::offset_parr[1][uVar4] = optimal_optimize::offset_parr[1][uVar4] + iVar8;
      iVar8 = optimal_optimize::offset_arr[1][uVar4];
      optimal_optimize::offset_arr[1][uVar4] = iVar8 + 1;
      if (iVar8 < -1) {
        printf_str = "offset1 counter wrapped!\n";
        goto joined_r0x0010d54c;
      }
    }
    if (uVar5 == 0) {
      if (~LOG_DEBUG < G_log_level) {
        G_log_log_level = LOG_ERROR;
        log_log_default("bad len\n");
      }
      exit(0);
    }
    uVar4 = pmVar9->offset;
    optimal_optimize::offset_parr[7][uVar4] = optimal_optimize::offset_parr[7][uVar4] + iVar8;
    iVar8 = optimal_optimize::offset_arr[7][uVar4];
    optimal_optimize::offset_arr[7][uVar4] = iVar8 + 1;
  } while ((-2 < iVar8) || (printf_str = "offset7 counter wrapped!\n", G_log_level < LOG_ERROR));
  goto LAB_0010d552;
LAB_0010d51a:
  uVar4 = pmVar9->offset;
  optimal_optimize::offset_parr[0][uVar4] = optimal_optimize::offset_parr[0][uVar4] + iVar8;
  iVar8 = optimal_optimize::offset_arr[0][uVar4];
  optimal_optimize::offset_arr[0][uVar4] = iVar8 + 1;
  if (iVar8 < -1) {
    printf_str = "offset0 counter wrapped!\n";
joined_r0x0010d54c:
    if (~LOG_DEBUG < G_log_level) {
LAB_0010d552:
      G_log_log_level = LOG_ERROR;
      log_log_default(printf_str);
    }
  }
  goto LAB_0010d43d;
}

Assistant:

void optimal_optimize(encode_match_data emd,    /* IN/OUT */
                      matchp_enum_get_next_f * f,       /* IN */
                      void *matchp_enum)        /* IN */
{
    encode_match_privp data;
    const_matchp mp;
    interval_nodep *offset;
    static int offset_arr[8][65536];
    static int offset_parr[8][65536];
    static int len_arr[65536];
    int treshold;

    int i, j;
    void *priv1;

    data = emd->priv;

    memset(offset_arr, 0, sizeof(offset_arr));
    memset(offset_parr, 0, sizeof(offset_parr));
    memset(len_arr, 0, sizeof(len_arr));

    offset = data->offset_f_priv;

    /* first the lens */
    priv1 = matchp_enum;
#if 0
    while ((mp = f(priv1)) != NULL)
    {
        LOG(LOG_DEBUG, ("%p len %d offset %d\n", mp, mp->len, mp->offset));
    }
    if(mp->len < 0)
    {
        LOG(LOG_ERROR, ("the horror, negative len!\n"));
    }
#endif
    while ((mp = f(priv1)) != NULL && mp->len > 0)
    {
        if (mp->offset > 0)
        {
            len_arr[mp->len] += 1;
            if(len_arr[mp->len] < 0)
            {
                LOG(LOG_ERROR, ("len counter wrapped!\n"));
            }
        }
    }

    for (i = 65534; i >= 0; --i)
    {
        len_arr[i] += len_arr[i + 1];
        if(len_arr[i] < 0)
        {
            LOG(LOG_ERROR, ("len counter wrapped!\n"));
        }
    }

    data->len_f_priv = exo_optimize(len_arr, NULL, 16, -1);

    /* then the offsets */
    priv1 = matchp_enum;
    while ((mp = f(priv1)) != NULL && mp->len > 0)
    {
        if (mp->offset > 0)
        {
            treshold = mp->len * 9;
            treshold -= 1 + (int) optimal_encode_int(mp->len,
                                                     data->len_f_priv,
                                                     NULL);
            switch (mp->len)
            {
            case 0:
                LOG(LOG_ERROR, ("bad len\n"));
                exit(0);
                break;
            case 1:
                offset_parr[0][mp->offset] += treshold;
                offset_arr[0][mp->offset] += 1;
                if(offset_arr[0][mp->offset] < 0)
                {
                    LOG(LOG_ERROR, ("offset0 counter wrapped!\n"));
                }
                break;
            case 2:
                offset_parr[1][mp->offset] += treshold;
                offset_arr[1][mp->offset] += 1;
                if(offset_arr[1][mp->offset] < 0)
                {
                    LOG(LOG_ERROR, ("offset1 counter wrapped!\n"));
                }
                break;
            default:
                offset_parr[7][mp->offset] += treshold;
                offset_arr[7][mp->offset] += 1;
                if(offset_arr[7][mp->offset] < 0)
                {
                    LOG(LOG_ERROR, ("offset7 counter wrapped!\n"));
                }
                break;
            }
        }
    }

    for (i = 65534; i >= 0; --i)
    {
        for (j = 0; j < 8; ++j)
        {
            offset_arr[j][i] += offset_arr[j][i + 1];
            offset_parr[j][i] += offset_parr[j][i + 1];
        }
    }

    offset[0] = exo_optimize(offset_arr[0], offset_parr[0], 1 << 2, 2);
    offset[1] = exo_optimize(offset_arr[1], offset_parr[1], 1 << 4, 4);
    offset[2] = exo_optimize(offset_arr[2], offset_parr[2], 1 << 4, 4);
    offset[3] = exo_optimize(offset_arr[3], offset_parr[3], 1 << 4, 4);
    offset[4] = exo_optimize(offset_arr[4], offset_parr[4], 1 << 4, 4);
    offset[5] = exo_optimize(offset_arr[5], offset_parr[5], 1 << 4, 4);
    offset[6] = exo_optimize(offset_arr[6], offset_parr[6], 1 << 4, 4);
    offset[7] = exo_optimize(offset_arr[7], offset_parr[7], 1 << 4, 4);

    if(IS_LOGGABLE(LOG_DEBUG))
    {
        optimal_dump(LOG_DEBUG, emd);
    }
}